

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTransformFeedbackTests.cpp
# Opt level: O2

IterateResult __thiscall gl3cts::TransformFeedback::DrawXFB::iterate(DrawXFB *this)

{
  ostringstream *poVar1;
  GLenum capture_mode;
  bool bVar2;
  bool bVar3;
  ContextType ctxType;
  ulong uVar4;
  char *description;
  qpTestResult testResult;
  TestContext *this_00;
  GLuint j;
  ulong uVar5;
  GLfloat *pGVar6;
  GLuint j_1;
  undefined1 local_1b0 [384];
  
  ctxType.super_ApiType.m_bits = (ApiType)(*this->m_context->m_renderCtx->_vptr_RenderContext[2])();
  bVar2 = glu::contextSupports(ctxType,(ApiType)0x104);
  bVar3 = glu::ContextInfo::isExtensionSupported
                    (this->m_context->m_contextInfo,"GL_ARB_transform_feedback2");
  if ((bVar2) || (bVar3)) {
    bVar2 = true;
    uVar4 = 0;
    while ((uVar4 < 2 && (bVar2 != false))) {
      capture_mode = s_capture_modes[uVar4];
      prepare(this,capture_mode);
      bindVAO(this,this->m_vao_id);
      useProgram(this,this->m_program_id_xfb);
      pGVar6 = s_colours[0] + 2;
      uVar5 = 0;
      while ((uVar5 < 3 && (bVar2 != false))) {
        bindXFB(this,this->m_xfb_id[uVar5]);
        bindBOForXFB(this,capture_mode,this->m_bo_id[uVar5]);
        useColour(this,this->m_program_id_xfb,(*(GLfloat (*) [4])(pGVar6 + -2))[0],pGVar6[-1],
                  *pGVar6,1.0);
        useGeometrySet(this,this->m_program_id_xfb,false);
        drawForCapture(this,true,true,false,false);
        bVar2 = inspectXFBState(this,true,true);
        uVar5 = uVar5 + 1;
        pGVar6 = pGVar6 + 4;
      }
      pGVar6 = s_colours[0] + 2;
      uVar5 = 0;
      while ((uVar5 < 3 && (bVar2 != false))) {
        bindXFB(this,this->m_xfb_id[uVar5]);
        useColour(this,this->m_program_id_xfb,(*(GLfloat (*) [4])(pGVar6 + -2))[0],pGVar6[-1],
                  *pGVar6,1.0);
        useGeometrySet(this,this->m_program_id_xfb,true);
        drawForCapture(this,false,false,true,true);
        bVar2 = inspectXFBState(this,false,false);
        uVar5 = uVar5 + 1;
        pGVar6 = pGVar6 + 4;
      }
      useProgram(this,this->m_program_id_draw);
      pGVar6 = s_colours[0] + 2;
      uVar5 = 0;
      while ((uVar5 < 3 && (bVar2 != false))) {
        bindXFB(this,this->m_xfb_id[uVar5]);
        bindBOForDraw(this,this->m_program_id_draw,capture_mode,this->m_bo_id[uVar5]);
        drawToFramebuffer(this,this->m_xfb_id[uVar5]);
        bVar2 = checkFramebuffer(this,(*(GLfloat (*) [4])(pGVar6 + -2))[0],pGVar6[-1],*pGVar6,1.0);
        uVar5 = uVar5 + 1;
        pGVar6 = pGVar6 + 4;
      }
      clean(this);
      uVar4 = uVar4 + 1;
    }
    if (bVar2 == false) {
      local_1b0._0_8_ = this->m_context->m_testCtx->m_log;
      poVar1 = (ostringstream *)(local_1b0 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::operator<<((ostream *)poVar1,"Draw XFB have failed.");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
      description = "Fail";
      testResult = QP_TEST_RESULT_FAIL;
      goto LAB_0093a5f3;
    }
  }
  local_1b0._0_8_ = this->m_context->m_testCtx->m_log;
  poVar1 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::operator<<((ostream *)poVar1,"Draw XFB have passed.");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
  description = "Pass";
  testResult = QP_TEST_RESULT_PASS;
LAB_0093a5f3:
  tcu::TestContext::setTestResult(this_00,testResult,description);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult gl3cts::TransformFeedback::DrawXFB::iterate(void)
{
	/* Initializations. */
	bool is_at_least_gl_40 = (glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::core(4, 0)));
	bool is_arb_tf_2	   = m_context.getContextInfo().isExtensionSupported("GL_ARB_transform_feedback2");

	bool is_ok		= true;
	bool test_error = false;

	/* Tests. */
	try
	{
		if (is_at_least_gl_40 || is_arb_tf_2)
		{
			for (glw::GLuint i = 0; (i < s_capture_modes_count) && is_ok; ++i)
			{
				prepare(s_capture_modes[i]);

				bindVAO(m_vao_id);
				useProgram(m_program_id_xfb);

				for (glw::GLuint j = 0; (j < s_xfb_count) && is_ok; ++j)
				{
					bindXFB(m_xfb_id[j]);
					bindBOForXFB(s_capture_modes[i], m_bo_id[j]);
					useColour(m_program_id_xfb, s_colours[j][0], s_colours[j][1], s_colours[j][2], s_colours[j][3]);
					useGeometrySet(m_program_id_xfb, false);
					drawForCapture(true, true, false, false);

					is_ok = is_ok && inspectXFBState(true, true);
				}

				for (glw::GLuint j = 0; (j < s_xfb_count) && is_ok; ++j)
				{
					bindXFB(m_xfb_id[j]);
					useColour(m_program_id_xfb, s_colours[j][0], s_colours[j][1], s_colours[j][2], s_colours[j][3]);
					useGeometrySet(m_program_id_xfb, true);
					drawForCapture(false, false, true, true);

					is_ok = is_ok && inspectXFBState(false, false);
				}

				useProgram(m_program_id_draw);

				for (glw::GLuint j = 0; (j < s_xfb_count) && is_ok; ++j)
				{
					bindXFB(m_xfb_id[j]);
					bindBOForDraw(m_program_id_draw, s_capture_modes[i], m_bo_id[j]);
					drawToFramebuffer(m_xfb_id[j]);

					is_ok =
						is_ok && checkFramebuffer(s_colours[j][0], s_colours[j][1], s_colours[j][2], s_colours[j][3]);
				}

				clean();
			}
		}
	}
	catch (...)
	{
		is_ok	  = false;
		test_error = true;
		clean();
	}

	/* Result's setup. */
	if (is_ok)
	{
		/* Log success. */
		m_context.getTestContext().getLog() << tcu::TestLog::Message << "Draw XFB have passed."
											<< tcu::TestLog::EndMessage;

		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		if (test_error)
		{
			/* Log error. */
			m_context.getTestContext().getLog() << tcu::TestLog::Message << "Draw XFB have approached error."
												<< tcu::TestLog::EndMessage;

			m_testCtx.setTestResult(QP_TEST_RESULT_INTERNAL_ERROR, "Error");
		}
		else
		{
			/* Log fail. */
			m_context.getTestContext().getLog() << tcu::TestLog::Message << "Draw XFB have failed."
												<< tcu::TestLog::EndMessage;

			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		}
	}

	return STOP;
}